

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O0

bool __thiscall FMultiPatchTexture::UseBasePalette(FMultiPatchTexture *this)

{
  uint uVar1;
  int local_1c;
  int i;
  FMultiPatchTexture *this_local;
  
  if ((*(ushort *)&(this->super_FTexture).field_0x31 >> 8 & 1) == 0) {
    for (local_1c = 0; local_1c < this->NumParts; local_1c = local_1c + 1) {
      uVar1 = (*(this->Parts[local_1c].Texture)->_vptr_FTexture[5])();
      if ((uVar1 & 1) == 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FMultiPatchTexture::UseBasePalette() 
{ 
	if (bComplex) return false;
	for(int i=0;i<NumParts;i++)
	{
		if (!Parts[i].Texture->UseBasePalette()) return false;
	}
	return true;
}